

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFrequencyOcSetFrequencyTarget(zes_freq_handle_t hFrequency,double CurrentOcFrequency)

{
  zes_pfnFrequencyOcSetFrequencyTarget_t pfnOcSetFrequencyTarget;
  ze_result_t result;
  double CurrentOcFrequency_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnOcSetFrequencyTarget._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc50 != (code *)0x0) {
    pfnOcSetFrequencyTarget._4_4_ = (*DAT_0011cc50)(CurrentOcFrequency,hFrequency);
  }
  return pfnOcSetFrequencyTarget._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcSetFrequencyTarget(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        double CurrentOcFrequency                       ///< [in] Overclocking Frequency in MHz, if extended moded is supported, it
                                                        ///< could be set in 1 Mhz granularity, else, in multiples of 50 Mhz. This
                                                        ///< cannot be greater than the `maxOcFrequency` member of
                                                        ///< ::zes_oc_capabilities_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOcSetFrequencyTarget = context.zesDdiTable.Frequency.pfnOcSetFrequencyTarget;
        if( nullptr != pfnOcSetFrequencyTarget )
        {
            result = pfnOcSetFrequencyTarget( hFrequency, CurrentOcFrequency );
        }
        else
        {
            // generic implementation
        }

        return result;
    }